

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.h
# Opt level: O2

cmCommand * __thiscall cmVariableWatchCommand::Clone(cmVariableWatchCommand *this)

{
  cmVariableWatchCommand *this_00;
  
  this_00 = (cmVariableWatchCommand *)operator_new(0x80);
  cmVariableWatchCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmVariableWatchCommand;
    }